

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.cc
# Opt level: O3

void * sk_pop(_STACK *st)

{
  long lVar1;
  char *pcVar2;
  
  if ((st != (_STACK *)0x0) && (lVar1 = *(long *)st, lVar1 != 0)) {
    pcVar2 = st->data[lVar1 + -1];
    *(long *)st = lVar1 + -1;
    return pcVar2;
  }
  return (void *)0x0;
}

Assistant:

void *OPENSSL_sk_pop(OPENSSL_STACK *sk) {
  if (sk == NULL) {
    return NULL;
  }
  if (sk->num == 0) {
    return NULL;
  }
  return OPENSSL_sk_delete(sk, sk->num - 1);
}